

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Genome::Attach(Genome *this,Ptr *pol)

{
  Ptr transcript;
  undefined1 auStack_68 [32];
  __shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  BuildTranscript((Genome *)auStack_68,(int)this,
                  ((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  stop_);
  std::__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Transcript,void>
            (local_48,(__shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2> *)auStack_68);
  MobileElementManager::Insert(&(this->super_Polymer).polymerases_,(Ptr *)&local_38,(Ptr *)local_48)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2> *)(auStack_68 + 0x10),
             (__shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2> *)auStack_68);
  Signal<std::shared_ptr<Transcript>_>::Emit
            (&this->transcript_signal_,(shared_ptr<Transcript> *)(auStack_68 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_68 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_68 + 8));
  return;
}

Assistant:

void Genome::Attach(MobileElement::Ptr pol) {
  Transcript::Ptr transcript = BuildTranscript(pol->stop(), stop_);
  polymerases_.Insert(pol, transcript);
  transcript_signal_.Emit(transcript);
}